

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O0

void __thiscall
Js::ProbeContainer::DispatchMutationBreakpoint
          (ProbeContainer *this,InterpreterHaltState *pHaltState)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_class_24_3_b22c6553 local_50;
  anon_class_24_3_a97cc3f1 local_38;
  int local_1c;
  InterpreterHaltState *pIStack_18;
  int currentOffset;
  InterpreterHaltState *pHaltState_local;
  ProbeContainer *this_local;
  
  pIStack_18 = pHaltState;
  pHaltState_local = (InterpreterHaltState *)this;
  if (pHaltState->stopType != STOP_MUTATIONBREAKPOINT) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                ,0x20d,"(pHaltState->stopType == STOP_MUTATIONBREAKPOINT)",
                                "pHaltState->stopType == STOP_MUTATIONBREAKPOINT");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::DispatchMutationBreakpoint: start: this=%p, pHaltState=%p\n",this,
                pIStack_18);
  bVar2 = CanDispatchHalt(this,pIStack_18);
  if (bVar2) {
    local_1c = -1;
    local_38.pHaltState = &stack0xffffffffffffffe8;
    local_38.currentOffset = &local_1c;
    local_50.currentOffset = &local_1c;
    local_50.pHaltState = &stack0xffffffffffffffe8;
    local_50.this = this;
    local_38.this = this;
    TryFinally<Js::ProbeContainer::DispatchMutationBreakpoint(Js::InterpreterHaltState*)::__0,Js::ProbeContainer::DispatchMutationBreakpoint(Js::InterpreterHaltState*)::__1>
              (&local_38,&local_50);
  }
  return;
}

Assistant:

void ProbeContainer::DispatchMutationBreakpoint(InterpreterHaltState* pHaltState)
    {
        Assert(pHaltState->stopType == STOP_MUTATIONBREAKPOINT);

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchMutationBreakpoint: start: this=%p, pHaltState=%p\n"), this, pHaltState);
        if (!CanDispatchHalt(pHaltState))
        {
            return;
        }

        // will store Current offset of the bytecode block.
        int currentOffset = -1;

        TryFinally([&]()
        {
            InitializeLocation(pHaltState);
            OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::DispatchMutationBreakpoint: initialized location: pHaltState=%p, pHaltState->IsValid()=%d\n"),
                pHaltState, pHaltState->IsValid());

            if (pHaltState->IsValid())
            {
                // For interpreter frames, change the current location pointer of bytecode block, as it might be pointing to the next statement on the body.
                // In order to generated proper binding of mutation statement, the bytecode offset needed to be on the same span of the statement.
                // For native frames the offset is always current.
                // Move back a single byte to ensure that it falls under on the same statement.
                if (pHaltState->topFrame->IsInterpreterFrame())
                {
                    currentOffset = pHaltState->GetCurrentOffset();
                    Assert(currentOffset > 0);
                    pHaltState->SetCurrentOffset(currentOffset - 1);
                }
                debugManager->stepController.Deactivate(pHaltState);
                debugManager->asyncBreakController.Deactivate();

                pHaltState->GetFunction()->CheckAndRegisterFuncToDiag(pScriptContext);

                Assert(pHaltState->GetFunction()->GetScriptContext() == pScriptContext);

                haltCallbackProbe->DispatchHalt(pHaltState);
            }
        },
        [&](bool)
        {
            // Restore the current offset;
            if (currentOffset != -1 && pHaltState->topFrame->IsInterpreterFrame())
            {
                pHaltState->SetCurrentOffset(currentOffset);
            }
            DestroyLocation();
        });

    }